

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void __thiscall MIDIStreamer::Stop(MIDIStreamer *this)

{
  int iVar1;
  
  this->EndQueued = 4;
  if (this->MIDI != (MIDIDevice *)0x0) {
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[4])();
    if ((char)iVar1 != '\0') {
      (*this->MIDI->_vptr_MIDIDevice[0xb])();
      (*this->MIDI->_vptr_MIDIDevice[0xd])(this->MIDI,this->Buffer);
      (*this->MIDI->_vptr_MIDIDevice[0xd])(this->MIDI,this->Buffer + 1);
      (*this->MIDI->_vptr_MIDIDevice[3])();
    }
  }
  if (this->MIDI != (MIDIDevice *)0x0) {
    (*this->MIDI->_vptr_MIDIDevice[1])();
    this->MIDI = (MIDIDevice *)0x0;
  }
  (this->super_MusInfo).m_Status = STATE_Stopped;
  return;
}

Assistant:

void MIDIStreamer::Stop()
{
	EndQueued = 4;
#ifdef _WIN32
	if (PlayerThread != NULL)
	{
		SetEvent(ExitEvent);
		WaitForSingleObject(PlayerThread, INFINITE);
		CloseHandle(PlayerThread);
		PlayerThread = NULL;
	}
#endif
	if (MIDI != NULL && MIDI->IsOpen())
	{
		MIDI->Stop();
		MIDI->UnprepareHeader(&Buffer[0]);
		MIDI->UnprepareHeader(&Buffer[1]);
		MIDI->Close();
	}
	if (MIDI != NULL)
	{
		delete MIDI;
		MIDI = NULL;
	}
	m_Status = STATE_Stopped;
}